

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafmode.c
# Opt level: O0

parser_error parse_graf_extra(parser *p)

{
  uint uVar1;
  void *pvVar2;
  graphics_mode *mode;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    uVar1 = parser_getuint(p,"alpha");
    *(char *)((long)pvVar2 + 9) = (char)uVar1;
    uVar1 = parser_getuint(p,"row");
    *(char *)((long)pvVar2 + 10) = (char)uVar1;
    uVar1 = parser_getuint(p,"max");
    *(char *)((long)pvVar2 + 0xb) = (char)uVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_graf_extra(struct parser *p) {
	graphics_mode *mode = parser_priv(p);
	if (!mode) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	mode->alphablend = parser_getuint(p, "alpha");
	mode->overdrawRow = parser_getuint(p, "row");
	mode->overdrawMax = parser_getuint(p, "max");
	return PARSE_ERROR_NONE;
}